

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::addFrameRotationConstraint
          (InverseKinematics *this,string *frameName,Transform *constraintValue)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::addFrameRotationConstraint(const std::string& frameName, const iDynTree::Transform& constraintValue)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->addFrameConstraint(internal::kinematics::TransformConstraint::rotationConstraint(frameName, constraintValue.getRotation()));
#else
        return missingIpoptErrorReport();
#endif
    }